

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O1

void __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::cancel
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this)

{
  int iVar1;
  error_category *peVar2;
  error_code __ec;
  error_code ec;
  error_code local_40;
  system_error local_30 [32];
  
  local_40._M_value = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  iVar1 = (this->impl_).implementation_.super_base_implementation_type.socket_;
  local_40._M_cat = peVar2;
  if (iVar1 == -1) {
    std::error_code::operator=(&local_40,bad_descriptor);
  }
  else {
    asio::detail::epoll_reactor::cancel_ops
              ((epoll_reactor *)
               (((this->impl_).service_)->super_reactive_socket_service_base).reactor_,iVar1,
               &(this->impl_).implementation_.super_base_implementation_type.reactor_data_);
    local_40._M_value = 0;
    local_40._M_cat = peVar2;
  }
  __ec._4_4_ = 0;
  __ec._M_value = local_40._M_value;
  if (local_40._M_value != 0) {
    __ec._M_cat = local_40._M_cat;
    std::system_error::system_error(local_30,__ec,"cancel");
    asio::detail::throw_exception<std::system_error>(local_30);
    std::system_error::~system_error(local_30);
  }
  return;
}

Assistant:

void cancel()
  {
    asio::error_code ec;
    impl_.get_service().cancel(impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "cancel");
  }